

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<std::array<float,784ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,float>>>
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4)

{
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *prVar1;
  const_reference pvVar2;
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  *this;
  point_wrapper_type point_wrapper;
  point<float,_784UL> p;
  size_t i;
  priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  *in_stack_fffffffffffff2f8;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *this_00;
  node_type *in_stack_fffffffffffff318;
  point_wrapper<pico_tree::internal::point<float,_784UL>_> this_01;
  undefined8 local_cd0;
  priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  local_cc8;
  point_wrapper<pico_tree::internal::point<float,_784UL>_> local_c78;
  point_type local_c70;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *local_30;
  undefined8 local_28;
  undefined8 local_20;
  void *local_18;
  undefined8 local_8;
  
  local_30 = (rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *)
             0x0;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_1;
  local_8 = param_2;
  while( true ) {
    this_00 = local_30;
    prVar1 = (rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *)
             std::
             vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
             ::size((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
                     *)((long)param_1 + 0x10));
    if (prVar1 <= this_00) break;
    this = (vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
            *)((long)param_1 + 0x10);
    std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
    ::operator[](this,(size_type)local_30);
    internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
    rotate_point<pico_tree::internal::point_wrapper<std::array<float,784ul>>>
              (this_00,(point_wrapper<std::array<float,_784UL>_> *)in_stack_fffffffffffff2f8);
    internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>::point_wrapper
              (&local_c78,&local_c70);
    pvVar2 = std::
             vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
             ::operator[](this,(size_type)local_30);
    internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::space_wrapper
              ((space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_> *)&local_cd0,
               (space_type *)&pvVar2->space);
    pvVar2 = std::
             vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
             ::operator[](this,(size_type)local_30);
    in_stack_fffffffffffff2f8 = &local_cc8;
    this_01.point_ = local_c78.point_;
    internal::
    priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
    ::priority_search_nearest_euclidean
              (in_stack_fffffffffffff2f8,local_cd0,&pvVar2->tree,local_c78.point_,local_20,local_28)
    ;
    std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
    ::operator[](this,(size_type)local_30);
    internal::
    priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
    ::operator()((priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                  *)this_01.point_,in_stack_fffffffffffff318);
    internal::
    priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
    ::~priority_search_nearest_euclidean
              ((priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                *)0x114d4b);
    local_30 = (rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *
               )((long)(local_30->rotation).elems_._M_elems + 1);
  }
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point,
      size_type max_leaves_visited,
      Visitor_& visitor,
      euclidean_space_tag) const {
    // Range based for loop (rightfully) results in a warning that shouldn't be
    // needed if the user creates the forest with at least a single tree.
    for (std::size_t i = 0; i < data_.size(); ++i) {
      auto p = data_[i].rotate_point(point);
      using point_wrapper_type = internal::point_wrapper<decltype(p)>;
      point_wrapper_type point_wrapper(p);
      internal::priority_search_nearest_euclidean<
          typename rkd_tree_data_type::space_wrapper_type,
          Metric_,
          point_wrapper_type,
          Visitor_,
          index_type>(
          typename rkd_tree_data_type::space_wrapper_type(data_[i].space),
          metric_,
          data_[i].tree.indices,
          point_wrapper,
          max_leaves_visited,
          visitor)(data_[i].tree.root_node);
    }
  }